

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *this,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *list)

{
  pointer pNVar1;
  long lVar2;
  char *pcVar3;
  pointer pNVar4;
  pointer pNVar5;
  long lVar6;
  ulong size;
  
  pNVar4 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar5 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  size = (long)pNVar5 - (long)pNVar4 >> 4;
  if (*(ulong *)(this + 0x10) < size) {
    ArenaVector<wasm::Name>::allocate((ArenaVector<wasm::Name> *)this,size);
    pNVar4 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar5 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (lVar6 = 0; pNVar1 = (pointer)((long)&(pNVar4->super_IString).str._M_len + lVar6),
      pNVar1 != pNVar5; lVar6 = lVar6 + 0x10) {
    lVar2 = *(long *)this;
    pcVar3 = (pNVar1->super_IString).str._M_str;
    *(size_t *)(lVar2 + lVar6) = (pNVar1->super_IString).str._M_len;
    ((size_t *)(lVar2 + lVar6))[1] = (size_t)pcVar3;
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }